

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O2

void ncnn::copy_make_border_image<unsigned_short>
               (Mat *src,Mat *dst,int top,int left,int type,unsigned_short v)

{
  int iVar1;
  long lVar2;
  int x_1;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  undefined2 *puVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  undefined2 *puVar12;
  long lVar13;
  void *pvVar14;
  int iVar15;
  undefined2 *puVar16;
  undefined2 *puVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  
  uVar11 = dst->w;
  lVar13 = (long)(int)uVar11;
  iVar1 = dst->h;
  puVar16 = (undefined2 *)src->data;
  pvVar14 = dst->data;
  lVar4 = (long)left;
  if (type == 0) {
    iVar3 = 0;
    uVar20 = 0;
    if (0 < (int)uVar11) {
      uVar20 = (ulong)uVar11;
    }
    iVar15 = 0;
    if (0 < top) {
      iVar15 = top;
    }
    lVar2 = lVar13 * 2;
    for (; iVar3 != iVar15; iVar3 = iVar3 + 1) {
      for (uVar10 = 0; uVar20 != uVar10; uVar10 = uVar10 + 1) {
        *(unsigned_short *)((long)pvVar14 + uVar10 * 2) = v;
      }
      pvVar14 = (void *)((long)pvVar14 + lVar2);
    }
    uVar10 = 0;
    if (0 < left) {
      uVar10 = (ulong)(uint)left;
    }
    for (; iVar15 < src->h + top; iVar15 = iVar15 + 1) {
      for (uVar5 = 0; uVar10 != uVar5; uVar5 = uVar5 + 1) {
        *(unsigned_short *)((long)pvVar14 + uVar5 * 2) = v;
      }
      uVar11 = src->w;
      if ((int)uVar11 < 0xc) {
        for (uVar5 = uVar10; (long)uVar5 < (long)(int)(left + uVar11); uVar5 = uVar5 + 1) {
          *(undefined2 *)((long)pvVar14 + uVar5 * 2) = puVar16[uVar5 - lVar4];
        }
      }
      else {
        memcpy((void *)(lVar4 * 2 + (long)pvVar14),puVar16,(ulong)uVar11 * 2);
        uVar11 = src->w;
        uVar5 = (ulong)(uVar11 + (int)uVar10);
      }
      for (lVar6 = (long)(int)uVar5; lVar6 < lVar13; lVar6 = lVar6 + 1) {
        *(unsigned_short *)((long)pvVar14 + lVar6 * 2) = v;
      }
      puVar16 = puVar16 + (int)uVar11;
      pvVar14 = (void *)((long)pvVar14 + lVar2);
    }
    for (; iVar15 < iVar1; iVar15 = iVar15 + 1) {
      for (uVar10 = 0; uVar20 != uVar10; uVar10 = uVar10 + 1) {
        *(unsigned_short *)((long)pvVar14 + uVar10 * 2) = v;
      }
      pvVar14 = (void *)((long)pvVar14 + lVar2);
    }
  }
  puVar17 = puVar16;
  if (type == 1) {
    iVar3 = 0;
    uVar20 = 0;
    if (0 < left) {
      uVar20 = (ulong)(uint)left;
    }
    iVar15 = 0;
    if (0 < top) {
      iVar15 = top;
    }
    lVar2 = lVar13 * 2;
    puVar8 = (undefined2 *)((long)pvVar14 + uVar20 * 2);
    for (; iVar18 = (int)uVar20, iVar3 != iVar15; iVar3 = iVar3 + 1) {
      for (uVar10 = 0; uVar20 != uVar10; uVar10 = uVar10 + 1) {
        *(undefined2 *)((long)pvVar14 + uVar10 * 2) = *puVar16;
      }
      uVar11 = src->w;
      if ((int)uVar11 < 0xc) {
        for (uVar10 = uVar20; (long)uVar10 < (long)(int)(uVar11 + left); uVar10 = uVar10 + 1) {
          *(undefined2 *)((long)pvVar14 + uVar10 * 2) = puVar16[uVar10 - lVar4];
        }
        iVar19 = src->w;
      }
      else {
        memcpy((void *)(lVar4 * 2 + (long)pvVar14),puVar16,(ulong)uVar11 * 2);
        iVar19 = src->w;
        uVar10 = (ulong)(uint)(iVar19 + iVar18);
      }
      for (lVar6 = (long)(int)uVar10; lVar6 < lVar13; lVar6 = lVar6 + 1) {
        *(undefined2 *)((long)pvVar14 + lVar6 * 2) = puVar16[iVar19 + -1];
      }
      pvVar14 = (void *)((long)pvVar14 + lVar2);
      puVar8 = puVar8 + lVar13;
    }
    for (; iVar15 < src->h + top; iVar15 = iVar15 + 1) {
      for (uVar10 = 0; uVar20 != uVar10; uVar10 = uVar10 + 1) {
        *(undefined2 *)((long)pvVar14 + uVar10 * 2) = *puVar16;
      }
      uVar11 = src->w;
      if ((int)uVar11 < 0xc) {
        for (uVar10 = uVar20; (long)uVar10 < (long)(int)(uVar11 + left); uVar10 = uVar10 + 1) {
          *(undefined2 *)((long)pvVar14 + uVar10 * 2) = puVar16[uVar10 - lVar4];
        }
        iVar3 = src->w;
      }
      else {
        memcpy((void *)(lVar4 * 2 + (long)pvVar14),puVar16,(ulong)uVar11 * 2);
        iVar3 = src->w;
        uVar10 = (ulong)(uint)(iVar3 + iVar18);
      }
      for (lVar6 = (long)(int)uVar10; lVar6 < lVar13; lVar6 = lVar6 + 1) {
        *(undefined2 *)((long)pvVar14 + lVar6 * 2) = puVar16[iVar3 + -1];
      }
      puVar16 = puVar16 + iVar3;
      pvVar14 = (void *)((long)pvVar14 + lVar2);
      puVar8 = puVar8 + lVar13;
    }
    uVar10 = (ulong)src->w;
    puVar17 = puVar16 + -uVar10;
    lVar6 = uVar10 * 2;
    for (; iVar15 < iVar1; iVar15 = iVar15 + 1) {
      for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
        *(undefined2 *)((long)pvVar14 + uVar5 * 2) = *puVar17;
      }
      iVar3 = (int)uVar10;
      if (iVar3 < 0xc) {
        puVar12 = puVar8;
        for (uVar5 = uVar20; (long)uVar5 < (long)(iVar3 + left); uVar5 = uVar5 + 1) {
          *puVar12 = *(undefined2 *)((long)puVar16 + (uVar5 * 2 - (lVar4 * 2 + lVar6)));
          puVar12 = puVar12 + 1;
        }
        uVar11 = src->w;
      }
      else {
        memcpy((void *)(lVar4 * 2 + (long)pvVar14),puVar17,(ulong)(uint)(iVar3 * 2));
        uVar11 = src->w;
        uVar5 = (ulong)(uVar11 + iVar18);
      }
      uVar10 = (ulong)uVar11;
      for (lVar7 = (long)(int)uVar5; lVar7 < lVar13; lVar7 = lVar7 + 1) {
        *(undefined2 *)((long)pvVar14 + lVar7 * 2) = puVar17[(long)(int)uVar11 + -1];
      }
      pvVar14 = (void *)((long)pvVar14 + lVar2);
      puVar8 = puVar8 + lVar13;
    }
  }
  if (type == 2) {
    iVar3 = src->w;
    puVar17 = puVar17 + iVar3 * top;
    iVar15 = 0;
    uVar20 = 0;
    if (0 < left) {
      uVar20 = (ulong)(uint)left;
    }
    iVar18 = 0;
    if (0 < top) {
      iVar18 = top;
    }
    lVar2 = lVar13 * 2;
    puVar16 = (undefined2 *)(uVar20 * 2 + (long)pvVar14);
    iVar19 = left + -2;
    for (; iVar9 = (int)uVar20, iVar15 != iVar18; iVar15 = iVar15 + 1) {
      puVar8 = puVar17 + lVar4;
      for (uVar10 = 0; uVar20 != uVar10; uVar10 = uVar10 + 1) {
        *(undefined2 *)((long)pvVar14 + uVar10 * 2) = *puVar8;
        puVar8 = puVar8 + -1;
      }
      if (iVar3 < 0xc) {
        for (uVar10 = uVar20; (long)uVar10 < (long)(iVar3 + left); uVar10 = uVar10 + 1) {
          *(undefined2 *)((long)pvVar14 + uVar10 * 2) = puVar17[uVar10 - lVar4];
        }
        iVar3 = src->w;
      }
      else {
        memcpy((void *)(lVar4 * 2 + (long)pvVar14),puVar17,(ulong)(uint)(iVar3 * 2));
        iVar3 = src->w;
        uVar10 = (ulong)(uint)(iVar3 + iVar9);
      }
      iVar9 = (iVar19 + iVar3 * 2) - (int)uVar10;
      for (lVar6 = (long)(int)uVar10; lVar6 < lVar13; lVar6 = lVar6 + 1) {
        *(undefined2 *)((long)pvVar14 + lVar6 * 2) = puVar17[iVar9];
        iVar9 = iVar9 + -1;
      }
      pvVar14 = (void *)((long)pvVar14 + lVar2);
      puVar17 = puVar17 + -(long)iVar3;
      puVar16 = puVar16 + lVar13;
    }
    for (; iVar18 < src->h + top; iVar18 = iVar18 + 1) {
      puVar8 = puVar17 + lVar4;
      for (uVar10 = 0; uVar20 != uVar10; uVar10 = uVar10 + 1) {
        *(undefined2 *)((long)pvVar14 + uVar10 * 2) = *puVar8;
        puVar8 = puVar8 + -1;
      }
      if (iVar3 < 0xc) {
        for (uVar10 = uVar20; (long)uVar10 < (long)(iVar3 + left); uVar10 = uVar10 + 1) {
          *(undefined2 *)((long)pvVar14 + uVar10 * 2) = puVar17[uVar10 - lVar4];
        }
        iVar3 = src->w;
      }
      else {
        memcpy((void *)(lVar4 * 2 + (long)pvVar14),puVar17,(ulong)(uint)(iVar3 * 2));
        iVar3 = src->w;
        uVar10 = (ulong)(uint)(iVar3 + iVar9);
      }
      iVar15 = (iVar19 + iVar3 * 2) - (int)uVar10;
      for (lVar6 = (long)(int)uVar10; lVar6 < lVar13; lVar6 = lVar6 + 1) {
        *(undefined2 *)((long)pvVar14 + lVar6 * 2) = puVar17[iVar15];
        iVar15 = iVar15 + -1;
      }
      puVar17 = puVar17 + iVar3;
      pvVar14 = (void *)((long)pvVar14 + lVar2);
      puVar16 = puVar16 + lVar13;
    }
    puVar17 = puVar17 + -(long)(iVar3 * 2);
    for (; iVar18 < iVar1; iVar18 = iVar18 + 1) {
      puVar8 = puVar17 + lVar4;
      for (uVar10 = 0; uVar20 != uVar10; uVar10 = uVar10 + 1) {
        *(undefined2 *)((long)pvVar14 + uVar10 * 2) = *puVar8;
        puVar8 = puVar8 + -1;
      }
      if (iVar3 < 0xc) {
        puVar8 = puVar16;
        for (uVar10 = uVar20; (long)uVar10 < (long)(iVar3 + left); uVar10 = uVar10 + 1) {
          *puVar8 = puVar17[uVar10 - lVar4];
          puVar8 = puVar8 + 1;
        }
        iVar3 = src->w;
      }
      else {
        memcpy((void *)(lVar4 * 2 + (long)pvVar14),puVar17,(ulong)(uint)(iVar3 * 2));
        iVar3 = src->w;
        uVar10 = (ulong)(uint)(iVar3 + iVar9);
      }
      iVar15 = (iVar19 + iVar3 * 2) - (int)uVar10;
      for (lVar6 = (long)(int)uVar10; lVar6 < lVar13; lVar6 = lVar6 + 1) {
        *(undefined2 *)((long)pvVar14 + lVar6 * 2) = puVar17[iVar15];
        iVar15 = iVar15 + -1;
      }
      pvVar14 = (void *)((long)pvVar14 + lVar2);
      puVar17 = puVar17 + -(long)iVar3;
      puVar16 = puVar16 + lVar13;
    }
  }
  return;
}

Assistant:

static void copy_make_border_image(const Mat& src, Mat& dst, int top, int left, int type, T v)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src;
    T* outptr = dst;

    if (type == 0)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = v;
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
    }

    if (type == 1)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
    }

    if (type == 2)
    {
        int y = 0;
        // fill top
        ptr += top * src.w;
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= 2 * src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
    }

}